

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::AsyncInputStream::pumpTo(AsyncInputStream *this,AsyncOutputStream *output,uint64_t amount)

{
  PromiseNode **this_00;
  NullableValue<kj::Promise<unsigned_long>_> *other;
  Promise<unsigned_long> *pPVar1;
  Promise<unsigned_long> *pPVar2;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar3;
  Promise<unsigned_long> PVar4;
  undefined1 local_88 [8];
  Promise<unsigned_long> promise;
  Own<kj::(anonymous_namespace)::AsyncPump> pump;
  Maybe<kj::Promise<unsigned_long>_> local_58;
  undefined1 local_40 [8];
  NullableValue<kj::Promise<unsigned_long>_> result;
  uint64_t amount_local;
  AsyncOutputStream *output_local;
  AsyncInputStream *this_local;
  
  (**(code **)(*(long *)amount + 0x10))();
  other = _::readMaybe<kj::Promise<unsigned_long>>(&local_58);
  _::NullableValue<kj::Promise<unsigned_long>_>::NullableValue
            ((NullableValue<kj::Promise<unsigned_long>_> *)local_40,other);
  Maybe<kj::Promise<unsigned_long>_>::~Maybe(&local_58);
  pPVar1 = _::NullableValue::operator_cast_to_Promise_((NullableValue *)local_40);
  if (pPVar1 != (Promise<unsigned_long> *)0x0) {
    pPVar2 = _::NullableValue<kj::Promise<unsigned_long>_>::operator*
                       ((NullableValue<kj::Promise<unsigned_long>_> *)local_40);
    pPVar2 = mv<kj::Promise<unsigned_long>>(pPVar2);
    Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,pPVar2);
  }
  _::NullableValue<kj::Promise<unsigned_long>_>::~NullableValue
            ((NullableValue<kj::Promise<unsigned_long>_> *)local_40);
  pPVar3 = extraout_RDX;
  if (pPVar1 == (Promise<unsigned_long> *)0x0) {
    this_00 = &promise.super_PromiseBase.node.ptr;
    heap<kj::(anonymous_namespace)::AsyncPump,kj::AsyncInputStream&,kj::AsyncOutputStream&,unsigned_long&>
              ((kj *)this_00,(AsyncInputStream *)output,(AsyncOutputStream *)amount,
               (unsigned_long *)((long)&result.field_1 + 8));
    Own<kj::(anonymous_namespace)::AsyncPump>::operator->
              ((Own<kj::(anonymous_namespace)::AsyncPump> *)this_00);
    anon_unknown_77::AsyncPump::pump((AsyncPump *)local_88);
    mv<kj::Own<kj::(anonymous_namespace)::AsyncPump>>
              ((Own<kj::(anonymous_namespace)::AsyncPump> *)&promise.super_PromiseBase.node.ptr);
    Promise<unsigned_long>::attach<kj::Own<kj::(anonymous_namespace)::AsyncPump>>
              ((Promise<unsigned_long> *)this,(Own<kj::(anonymous_namespace)::AsyncPump> *)local_88)
    ;
    Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)local_88);
    Own<kj::(anonymous_namespace)::AsyncPump>::~Own
              ((Own<kj::(anonymous_namespace)::AsyncPump> *)&promise.super_PromiseBase.node.ptr);
    pPVar3 = extraout_RDX_00;
  }
  PVar4.super_PromiseBase.node.ptr = pPVar3;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar4.super_PromiseBase.node;
}

Assistant:

Promise<uint64_t> AsyncInputStream::pumpTo(
    AsyncOutputStream& output, uint64_t amount) {
  // See if output wants to dispatch on us.
  KJ_IF_MAYBE(result, output.tryPumpFrom(*this, amount)) {
    return kj::mv(*result);
  }

  // OK, fall back to naive approach.
  auto pump = heap<AsyncPump>(*this, output, amount);
  auto promise = pump->pump();
  return promise.attach(kj::mv(pump));
}